

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O2

void __thiscall
draco::OctahedronToolBox::IntegerVectorToQuantizedOctahedralCoords
          (OctahedronToolBox *this,int32_t *int_vec,int32_t *out_s,int32_t *out_t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = int_vec[1];
  if (-1 < *int_vec) {
    CanonicalizeOctahedralCoords
              (this,iVar1 + this->center_value_,this->center_value_ + int_vec[2],out_s,out_t);
    return;
  }
  if (iVar1 < 0) {
    iVar2 = int_vec[2];
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
  }
  else {
    iVar2 = int_vec[2];
    iVar3 = -iVar2;
    if (iVar2 < 1) {
      iVar3 = iVar2;
    }
    iVar3 = iVar3 + this->max_value_;
  }
  if (-1 < iVar2) {
    iVar2 = -iVar1;
    if (iVar1 < 1) {
      iVar2 = iVar1;
    }
    CanonicalizeOctahedralCoords(this,iVar3,iVar2 + this->max_value_,out_s,out_t);
    return;
  }
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  CanonicalizeOctahedralCoords(this,iVar3,iVar2,out_s,out_t);
  return;
}

Assistant:

inline void IntegerVectorToQuantizedOctahedralCoords(const int32_t *int_vec,
                                                       int32_t *out_s,
                                                       int32_t *out_t) const {
    DRACO_DCHECK_EQ(
        std::abs(int_vec[0]) + std::abs(int_vec[1]) + std::abs(int_vec[2]),
        center_value_);
    int32_t s, t;
    if (int_vec[0] >= 0) {
      // Right hemisphere.
      s = (int_vec[1] + center_value_);
      t = (int_vec[2] + center_value_);
    } else {
      // Left hemisphere.
      if (int_vec[1] < 0) {
        s = std::abs(int_vec[2]);
      } else {
        s = (max_value_ - std::abs(int_vec[2]));
      }
      if (int_vec[2] < 0) {
        t = std::abs(int_vec[1]);
      } else {
        t = (max_value_ - std::abs(int_vec[1]));
      }
    }
    CanonicalizeOctahedralCoords(s, t, out_s, out_t);
  }